

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void xy_y_convolve_4tap_32x2_avx2
               (int16_t *src,ptrdiff_t stride,__m256i *s_256,__m256i *ss_256,__m256i *tt_256,
               __m256i *coeffs,__m256i *r)

{
  __m256i alVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  
  alVar1 = *(__m256i *)(src + stride * 3);
  s_256[3] = alVar1;
  alVar1 = (__m256i)vpunpcklwd_avx2((undefined1  [32])s_256[2],(undefined1  [32])alVar1);
  ss_256[1] = alVar1;
  alVar1 = (__m256i)vpunpckhwd_avx2((undefined1  [32])s_256[2],(undefined1  [32])s_256[3]);
  ss_256[3] = alVar1;
  alVar1 = *(__m256i *)(src + stride * 4);
  s_256[2] = alVar1;
  alVar1 = (__m256i)vpunpcklwd_avx2((undefined1  [32])s_256[3],(undefined1  [32])alVar1);
  tt_256[1] = alVar1;
  alVar1 = (__m256i)vpunpckhwd_avx2((undefined1  [32])s_256[3],(undefined1  [32])s_256[2]);
  tt_256[3] = alVar1;
  xy_y_convolve_4tap_16_avx2(ss_256,coeffs,r);
  xy_y_convolve_4tap_16_avx2(tt_256,coeffs,r + 2);
  lVar2 = ss_256[1][1];
  lVar3 = ss_256[1][2];
  lVar4 = ss_256[1][3];
  lVar5 = ss_256[3][0];
  lVar6 = ss_256[3][1];
  lVar7 = ss_256[3][2];
  lVar8 = ss_256[3][3];
  (*ss_256)[0] = ss_256[1][0];
  (*ss_256)[1] = lVar2;
  (*ss_256)[2] = lVar3;
  (*ss_256)[3] = lVar4;
  ss_256[2][0] = lVar5;
  ss_256[2][1] = lVar6;
  ss_256[2][2] = lVar7;
  ss_256[2][3] = lVar8;
  lVar2 = tt_256[1][1];
  lVar3 = tt_256[1][2];
  lVar4 = tt_256[1][3];
  lVar5 = tt_256[3][0];
  lVar6 = tt_256[3][1];
  lVar7 = tt_256[3][2];
  lVar8 = tt_256[3][3];
  (*tt_256)[0] = tt_256[1][0];
  (*tt_256)[1] = lVar2;
  (*tt_256)[2] = lVar3;
  (*tt_256)[3] = lVar4;
  tt_256[2][0] = lVar5;
  tt_256[2][1] = lVar6;
  tt_256[2][2] = lVar7;
  tt_256[2][3] = lVar8;
  return;
}

Assistant:

static inline void xy_y_convolve_4tap_32x2_avx2(
    const int16_t *const src, const ptrdiff_t stride, __m256i s_256[4],
    __m256i ss_256[4], __m256i tt_256[4], const __m256i coeffs[2],
    __m256i r[4]) {
  s_256[3] = _mm256_loadu_si256((__m256i *)(src + 3 * stride));
  ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
  ss_256[3] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);
  s_256[2] = _mm256_loadu_si256((__m256i *)(src + 4 * stride));
  tt_256[1] = _mm256_unpacklo_epi16(s_256[3], s_256[2]);
  tt_256[3] = _mm256_unpackhi_epi16(s_256[3], s_256[2]);
  xy_y_convolve_4tap_16_avx2(ss_256, coeffs, r + 0);
  xy_y_convolve_4tap_16_avx2(tt_256, coeffs, r + 2);
  ss_256[0] = ss_256[1];
  ss_256[2] = ss_256[3];
  tt_256[0] = tt_256[1];
  tt_256[2] = tt_256[3];
}